

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

Fl_Tree_Item * __thiscall
Fl_Tree_Item::insert_above(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs,char *new_label)

{
  int iVar1;
  Fl_Tree_Item *pFVar2;
  Fl_Tree_Item *pFVar3;
  Fl_Tree_Item *c;
  int t;
  Fl_Tree_Item *p;
  char *new_label_local;
  Fl_Tree_Prefs *prefs_local;
  Fl_Tree_Item *this_local;
  
  pFVar3 = this->_parent;
  if (pFVar3 != (Fl_Tree_Item *)0x0) {
    for (c._4_4_ = 0; iVar1 = children(pFVar3), c._4_4_ < iVar1; c._4_4_ = c._4_4_ + 1) {
      pFVar2 = child(pFVar3,c._4_4_);
      if (this == pFVar2) {
        pFVar3 = insert(pFVar3,prefs,new_label,c._4_4_);
        return pFVar3;
      }
    }
  }
  return (Fl_Tree_Item *)0x0;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::insert_above(const Fl_Tree_Prefs &prefs, const char *new_label) {
  Fl_Tree_Item *p = _parent;
  if ( ! p ) return(0);
  // Walk our parent's children to find ourself
  for ( int t=0; t<p->children(); t++ ) {
    Fl_Tree_Item *c = p->child(t);
    if ( this == c ) {
      return(p->insert(prefs, new_label, t));
    }
  }
  return(0);
}